

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O2

void DetectorOutput::callback(Race *race,void *context)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  
  uVar1 = (race->first).stack_trace._M_elems[0];
  if ((callback::s1 != uVar1) &&
     (uVar2 = (race->second).stack_trace._M_elems[0], callback::s2 != uVar2)) {
    callback::s1 = uVar1;
    callback::s2 = uVar2;
    poVar3 = std::operator<<((ostream *)&std::cout,"pc:   ");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"addr: ");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"rw:   ");
    pcVar5 = "read";
    pcVar4 = "read";
    if ((race->first).write != false) {
      pcVar4 = "write";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," ");
    if ((race->second).write != false) {
      pcVar5 = "write";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"tid:  ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"race: ");
    callback::i = callback::i + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,callback::i);
    std::operator<<(poVar3,"\n");
    return;
  }
  return;
}

Assistant:

static void callback(const Detector::Race* race, void* context) {
    static uintptr_t s1 = 0, s2 = 0;
    if (s1 != race->first.stack_trace[0] && s2 != race->second.stack_trace[0]) {
      static int i = 0;
      s1 = race->first.stack_trace[0];
      s2 = race->second.stack_trace[0];
      std::cout << "pc:   " << (void*)(s1) << " " << (void*)(s2) << std::endl
                << "addr: " << (void*)(race->first.accessed_memory) << std::endl
                << "rw:   " << (race->first.write ? "write" : "read") << " "
                << (race->second.write ? "write" : "read") << std::endl
                << "tid:  " << std::hex << race->first.thread_id << " "
                << std::hex << race->second.thread_id << std::endl;
      std::cout << "race: " << ++i << "\n";
    }
  }